

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
insert<kj::HashMap<kj::String,int>::Entry,kj::String&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,size_t pos,String *params)

{
  uint uVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar10;
  uchar *puVar11;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar12;
  long lVar13;
  HashBucket *s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar14;
  HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *this_00;
  ulong targetSize;
  uchar *puVar15;
  char *__s1;
  long lVar16;
  long *in_R9;
  Maybe<unsigned_long> MVar17;
  ArrayPtr<const_unsigned_char> s_00;
  char *local_58;
  
  this_00 = (HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *)table.ptr;
  uVar5 = *(long *)(this_00 + 0x18) * 2;
  if (uVar5 < (*(long *)(this_00 + 8) + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar5) {
      targetSize = uVar5;
    }
    HashIndex<kj::HashMap<kj::String,_int>::Callbacks>::rehash(this_00,targetSize);
  }
  puVar2 = (uchar *)in_R9[1];
  puVar15 = puVar2;
  if (puVar2 != (uchar *)0x0) {
    puVar15 = (uchar *)*in_R9;
  }
  puVar11 = puVar2 + -1;
  if (puVar2 == (uchar *)0x0) {
    puVar11 = (uchar *)0x0;
  }
  s_00.size_ = (size_t)puVar11;
  s_00.ptr = puVar15;
  uVar6 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s_00);
  uVar7 = _::chooseBucket((uint)(uVar6 != 0),*(uint *)(this_00 + 0x18));
  lVar3 = in_R9[1];
  lVar16 = lVar3 + (ulong)(lVar3 == 0);
  local_58 = "";
  if (lVar3 != 0) {
    local_58 = (char *)*in_R9;
  }
  lVar3 = *(long *)(this_00 + 0x10);
  lVar4 = *(long *)(this_00 + 0x18);
  paVar14 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  do {
    paVar10 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (lVar3 + (ulong)uVar7 * 8);
    uVar1 = *(uint *)((long)paVar10 + 4);
    if (uVar1 == 1) {
      if (paVar14 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar14 = paVar10;
      }
    }
    else {
      if (uVar1 == 0) {
        if (paVar14 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
          paVar10 = paVar14;
        }
        aVar12.value = ((ulong)(uVar6 != 0) | (long)params << 0x20) + 0x200000000;
        paVar10->value = (unsigned_long)aVar12;
        *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
        goto LAB_00156f71;
      }
      if (*(uint *)paVar10 == (uint)(uVar6 != 0)) {
        lVar9 = (ulong)(uVar1 - 2) * 0x20;
        lVar13 = *(long *)(table.size_ + 8 + lVar9);
        if (lVar13 + (ulong)(lVar13 == 0) == lVar16) {
          __s1 = "";
          if (lVar13 != 0) {
            __s1 = *(char **)(lVar9 + table.size_);
          }
          iVar8 = bcmp(__s1,local_58,lVar16 - 1);
          if (iVar8 == 0) {
            *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x1;
            *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
            aVar12 = extraout_RDX;
LAB_00156f71:
            MVar17.ptr.field_1.value = aVar12.value;
            MVar17.ptr._0_8_ = this;
            return (Maybe<unsigned_long>)MVar17.ptr;
          }
        }
      }
    }
    lVar13 = (ulong)uVar7 + 1;
    uVar7 = (uint)lVar13;
    if (lVar13 == lVar4) {
      uVar7 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }